

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

char * __thiscall cmCacheManager::CacheEntry::GetProperty(CacheEntry *this,string *prop)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)prop);
  if (iVar1 == 0) {
    pcVar2 = cmState::CacheEntryTypeToString(this->Type);
    return pcVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)prop);
  if (iVar1 != 0) {
    pcVar2 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
    return pcVar2;
  }
  return (this->Value)._M_dataplus._M_p;
}

Assistant:

const char* cmCacheManager::CacheEntry::GetProperty(
  const std::string& prop) const
{
  if (prop == "TYPE") {
    return cmState::CacheEntryTypeToString(this->Type);
  }
  if (prop == "VALUE") {
    return this->Value.c_str();
  }
  return this->Properties.GetPropertyValue(prop);
}